

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biasmultiply.cc
# Opt level: O2

duration<double,_std::ratio<1L,_1L>_>
testNew<intgemm::SSSE3::Kernels8>(Index A_rows,Index width,Index B_cols)

{
  UnquantizeAndAddBiasAndWrite callback;
  UnquantizeAndAddBiasAndWrite callback_00;
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  Index cols;
  undefined8 in_R8;
  long lVar4;
  result_type_conflict rVar5;
  AlignedVector<float> bias;
  AlignedVector<float> B;
  AlignedVector<float> A;
  AlignedVector<signed_char> B_prep;
  param_type local_1410;
  AlignedVector<unsigned_char> A_prep;
  AlignedVector<float> test_C;
  undefined4 uStack_13e4;
  undefined4 uStack_13cc;
  mt19937 gen;
  
  intgemm::AlignedVector<float>::AlignedVector(&A,(ulong)(width * A_rows),0x40);
  intgemm::AlignedVector<float>::AlignedVector(&B,(ulong)(B_cols * width),0x40);
  intgemm::AlignedVector<float>::AlignedVector(&bias,(ulong)B_cols,0x40);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&gen);
  pfVar1 = A.mem_;
  local_1410._M_a = -1.0;
  local_1410._M_b = 1.0;
  lVar4 = A.size_ << 2;
  for (lVar3 = 0; pfVar2 = B.mem_, lVar4 != lVar3; lVar3 = lVar3 + 4) {
    rVar5 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&local_1410,&gen);
    *(result_type_conflict *)((long)pfVar1 + lVar3) = rVar5;
  }
  lVar4 = B.size_ << 2;
  for (lVar3 = 0; pfVar1 = bias.mem_, lVar4 != lVar3; lVar3 = lVar3 + 4) {
    rVar5 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&local_1410,&gen);
    *(result_type_conflict *)((long)pfVar2 + lVar3) = rVar5;
  }
  for (lVar3 = 0; cols = (Index)in_R8, bias.size_ << 2 != lVar3; lVar3 = lVar3 + 4) {
    rVar5 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&local_1410,&gen);
    *(result_type_conflict *)((long)pfVar1 + lVar3) = rVar5;
  }
  intgemm::AlignedVector<unsigned_char>::AlignedVector(&A_prep,A.size_,0x40);
  intgemm::AlignedVector<signed_char>::AlignedVector(&B_prep,B.size_,0x40);
  intgemm::SSSE3::Kernels8::PrepareA(A.mem_,A_prep.mem_,63.5,A_rows,width);
  intgemm::SSSE3::Kernels8::PrepareB
            ((Kernels8 *)B.mem_,(float *)B_prep.mem_,(int8_t *)(ulong)width,63.5,B_cols,cols);
  intgemm::AlignedVector<float>::AlignedVector(&test_C,(ulong)(B_cols * A_rows),0x40);
  callback._4_4_ = uStack_13cc;
  callback.unquant_mult = -0.031496063;
  callback.bias_addr = bias.mem_;
  callback.output_addr = bias.mem_;
  intgemm::SSSE3::Kernels8::PrepareBias<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (B_prep.mem_,width,B_cols,callback);
  lVar3 = std::chrono::_V2::system_clock::now();
  callback_00._4_4_ = uStack_13e4;
  callback_00.unquant_mult = 0.0002480005;
  callback_00.bias_addr = bias.mem_;
  callback_00.output_addr = test_C.mem_;
  intgemm::SSSE3::Kernels8::Multiply8Shift<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (A_prep.mem_,B_prep.mem_,A_rows,width,B_cols,callback_00);
  lVar4 = std::chrono::_V2::system_clock::now();
  free(test_C.mem_);
  free(B_prep.mem_);
  free(A_prep.mem_);
  free(bias.mem_);
  free(B.mem_);
  free(A.mem_);
  return (duration<double,_std::ratio<1L,_1L>_>)((double)(lVar4 - lVar3) / 1000000000.0);
}

Assistant:

std::chrono::duration<double> testNew(Index A_rows, Index width, Index B_cols) {
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = dist(gen);
  }

  float alpha = 2.0f;
  float quant_mult = 127.0f / alpha;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<uint8_t> A_prep(A.size());
  AlignedVector<int8_t> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  float unquant_mult_forprep = (-1)*(alpha)*(alpha)/(127.0f); //Minus one to invert add_ps later on
  Routine::PrepareBias(B_prep.begin(), width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult_forprep, bias.begin(), bias.begin()));
  auto start = std::chrono::system_clock::now();
  Routine::Multiply8Shift(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), test_C.begin()));
  auto end = std::chrono::system_clock::now();

  std::chrono::duration<double> elapsed_seconds = end-start;
  return elapsed_seconds;

}